

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaXPathProcessHistory(xmlSchemaValidCtxtPtr vctxt,int depth)

{
  int iVar1;
  xmlSchemaTypeType xVar2;
  xmlSchemaIDCMatcherPtr_conflict pxVar3;
  xmlSchemaIDCPtr_conflict pxVar4;
  xmlSchemaNodeInfoPtr pxVar5;
  uint uVar6;
  int iVar7;
  xmlSchemaItemListPtr pxVar8;
  long *plVar9;
  xmlSchemaPSVIIDCKeyPtr **pppxVar10;
  xmlChar *pxVar11;
  xmlSchemaPSVIIDCNodePtr pxVar12;
  xmlNodePtr pxVar13;
  xmlSchemaPSVIIDCKeyPtr *ppxVar14;
  xmlChar *pxVar15;
  xmlSchemaPSVIIDCNodePtr *ppxVar16;
  xmlHashTablePtr pxVar17;
  undefined8 *userdata;
  undefined8 *puVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  int *in_R8;
  char *pcVar22;
  xmlSchemaTypePtr pxVar23;
  long lVar24;
  xmlSchemaTypePtr pxVar25;
  xmlSchemaIDCStateObjPtr_conflict pxVar26;
  xmlSchemaIDCStateObjPtr pxVar27;
  xmlChar *str;
  xmlChar *strB;
  xmlChar *local_88;
  xmlSchemaPSVIIDCNodePtr local_80;
  xmlSchemaTypePtr local_78;
  ulong local_70;
  xmlNodePtr local_68;
  xmlSchemaItemListPtr local_60;
  xmlSchemaIDCPtr_conflict local_58;
  xmlChar *local_50;
  xmlChar *local_48;
  xmlChar *local_40;
  long local_38;
  
  if (vctxt->xpathStates != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
    pxVar25 = vctxt->inode->typeDef;
    local_38 = (long)depth;
    local_68 = (xmlNodePtr)0x0;
    pxVar26 = vctxt->xpathStates;
    do {
      pcVar22 = "calling xmlStreamPop()";
      iVar7 = xmlStreamPop((xmlStreamCtxtPtr)pxVar26->xpathCtxt);
      if (iVar7 == -1) {
LAB_001cfe2b:
        xmlSchemaInternalErr2
                  ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaXPathProcessHistory",pcVar22,
                   (xmlChar *)0x0,(xmlChar *)in_R8);
        return -1;
      }
      if ((long)pxVar26->nbHistory == 0) goto LAB_001cf841;
      if (pxVar26->history[(long)pxVar26->nbHistory + -1] == depth) {
        in_R8 = &pxVar26->nbHistory;
        if (pxVar26->type == 1) {
          pxVar3 = pxVar26->matcher;
          pxVar4 = pxVar3->aidc->def;
          if ((pxVar3->keySeqs == (xmlSchemaPSVIIDCKeyPtr **)0x0) ||
             (lVar20 = local_38 - pxVar3->depth, pxVar3->sizeKeySeqs <= (int)lVar20)) {
            xVar2 = pxVar4->type;
            pppxVar10 = (xmlSchemaPSVIIDCKeyPtr **)0x0;
LAB_001cf436:
            local_78 = pxVar25;
            if (xVar2 == XML_SCHEMA_TYPE_IDC_KEY) {
              local_88 = (xmlChar *)0x0;
              pxVar15 = xmlSchemaGetComponentDesignation(&local_88,pxVar4);
              xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_IDC,
                                  (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)pxVar4,
                                  "Not all fields of %s evaluate to a node",pxVar15,(xmlChar *)0x0,
                                  (xmlChar *)0x0,(xmlChar *)0x0);
              if (local_88 != (xmlChar *)0x0) {
                (*xmlFree)(local_88);
                local_88 = (xmlChar *)0x0;
              }
            }
LAB_001cf4af:
            iVar7 = 0;
            if ((pppxVar10 != (xmlSchemaPSVIIDCKeyPtr **)0x0) &&
               (*pppxVar10 != (xmlSchemaPSVIIDCKeyPtr *)0x0)) {
              (*xmlFree)(*pppxVar10);
              iVar7 = 0;
              *pppxVar10 = (xmlSchemaPSVIIDCKeyPtr *)0x0;
            }
          }
          else {
            pppxVar10 = pxVar3->keySeqs + lVar20;
            if (*pppxVar10 == (xmlSchemaPSVIIDCKeyPtr *)0x0) {
LAB_001cf433:
              xVar2 = pxVar4->type;
              goto LAB_001cf436;
            }
            uVar19 = (ulong)(uint)pxVar4->nbFields;
            if (0 < pxVar4->nbFields) {
              uVar21 = 0;
              do {
                if ((*pppxVar10)[uVar21] == (xmlSchemaPSVIIDCKeyPtr)0x0) goto LAB_001cf433;
                uVar21 = uVar21 + 1;
              } while (uVar19 != uVar21);
            }
            local_78 = pxVar25;
            local_70 = uVar19;
            local_58 = pxVar4;
            if (pxVar3->targets == (xmlSchemaItemListPtr)0x0) {
              pxVar8 = xmlSchemaItemListCreate();
              pxVar3->targets = pxVar8;
            }
            pxVar8 = pxVar3->targets;
            if ((local_58->type != XML_SCHEMA_TYPE_IDC_KEYREF) && (pxVar8->nbItems != 0)) {
              local_60 = pxVar8;
              if (pxVar3->htab == (xmlHashTablePtr)0x0) {
                plVar9 = (long *)0x0;
              }
              else {
                local_88 = (xmlChar *)0x0;
                xmlSchemaFormatIDCKeySequence_1(vctxt,&local_88,*pppxVar10,(int)local_70,1);
                pxVar15 = local_88;
                plVar9 = (long *)xmlHashLookup(pxVar3->htab,local_88);
                if (pxVar15 != (xmlChar *)0x0) {
                  (*xmlFree)(pxVar15);
                  local_88 = (xmlChar *)0x0;
                }
              }
              iVar7 = 0;
              uVar19 = local_70;
              if (plVar9 != (long *)0x0) {
                do {
                  if (0 < (int)uVar19) {
                    local_80 = *(xmlSchemaPSVIIDCNodePtr *)
                                ((long)local_60->items[(int)plVar9[1]] + 8);
                    uVar21 = 0;
                    while( true ) {
                      iVar7 = xmlSchemaAreValuesEqual
                                        ((*pppxVar10)[uVar21]->val,
                                         *(xmlSchemaValPtr *)&(&local_80->node)[uVar21]->type);
                      if (iVar7 == -1) {
                        iVar7 = 1;
                        goto LAB_001cf9df;
                      }
                      uVar19 = local_70;
                      if (iVar7 == 0) break;
                      uVar21 = uVar21 + 1;
                      if (local_70 == uVar21) {
                        local_88 = (xmlChar *)0x0;
                        local_48 = (xmlChar *)0x0;
                        pxVar15 = xmlSchemaFormatIDCKeySequence_1
                                            (vctxt,&local_88,*pppxVar10,(int)local_70,0);
                        pxVar4 = local_58;
                        pxVar11 = xmlSchemaGetComponentDesignation(&local_48,local_58);
                        xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_IDC,
                                            (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)pxVar4,
                                            "Duplicate key-sequence %s in %s",pxVar15,pxVar11,
                                            (xmlChar *)0x0,(xmlChar *)0x0);
                        if (local_88 != (xmlChar *)0x0) {
                          (*xmlFree)(local_88);
                          local_88 = (xmlChar *)0x0;
                        }
                        if (local_48 != (xmlChar *)0x0) {
                          (*xmlFree)(local_48);
                          local_48 = (xmlChar *)0x0;
                        }
                        iVar7 = 0xb;
                        goto LAB_001cf9df;
                      }
                    }
                  }
                  plVar9 = (long *)*plVar9;
                } while (plVar9 != (long *)0x0);
                iVar7 = 0;
              }
LAB_001cf9df:
              if (iVar7 != 0xb) {
                pxVar8 = local_60;
                if (iVar7 == 0) goto LAB_001cf9f5;
                goto LAB_001cf4df;
              }
              goto LAB_001cf4af;
            }
LAB_001cf9f5:
            pxVar12 = (xmlSchemaPSVIIDCNodePtr)(*xmlMalloc)(0x18);
            if (pxVar12 == (xmlSchemaPSVIIDCNodePtr)0x0) {
              __xmlSimpleError(0x11,2,(xmlNodePtr)0x0,(char *)0x0,
                               "allocating an IDC node-table item");
              (*xmlFree)(*pppxVar10);
              *pppxVar10 = (xmlSchemaPSVIIDCKeyPtr *)0x0;
            }
            else {
              pxVar12->node = (xmlNodePtr)0x0;
              pxVar12->keys = (xmlSchemaPSVIIDCKeyPtr *)0x0;
              pxVar12->nodeLine = 0;
              pxVar12->nodeQNameID = 0;
              local_80 = pxVar12;
              if (local_58->type == XML_SCHEMA_TYPE_IDC_KEYREF) {
                local_50 = vctxt->inode->nsName;
                iVar7 = -1;
                local_60 = pxVar8;
                pxVar15 = xmlDictLookup(vctxt->dict,vctxt->inode->localName,-1);
                if (pxVar15 != (xmlChar *)0x0) {
                  if (local_50 == (xmlChar *)0x0) {
                    pxVar11 = (xmlChar *)0x0;
                  }
                  else {
                    iVar7 = -1;
                    local_40 = pxVar15;
                    pxVar11 = xmlDictLookup(vctxt->dict,local_50,-1);
                    pxVar15 = local_40;
                    if (pxVar11 == (xmlChar *)0x0) goto LAB_001cfbe1;
                  }
                  pxVar8 = vctxt->nodeQNames;
                  iVar7 = pxVar8->nbItems;
                  if (0 < iVar7) {
                    lVar20 = 0;
                    do {
                      if (((xmlChar *)pxVar8->items[lVar20] == pxVar15) &&
                         ((xmlChar *)pxVar8->items[lVar20 + 1] == pxVar11)) {
                        iVar7 = (int)lVar20;
                        goto LAB_001cfbe1;
                      }
                      lVar20 = lVar20 + 2;
                    } while ((int)lVar20 < iVar7);
                  }
                  local_50 = pxVar11;
                  xmlSchemaItemListAdd(pxVar8,pxVar15);
                  xmlSchemaItemListAdd(vctxt->nodeQNames,local_50);
                }
LAB_001cfbe1:
                local_80->nodeQNameID = iVar7;
                pxVar8 = local_60;
                if (iVar7 == -1) {
                  (*xmlFree)(local_80);
LAB_001cfdfa:
                  (*xmlFree)(*pppxVar10);
                  *pppxVar10 = (xmlSchemaPSVIIDCKeyPtr *)0x0;
                  goto LAB_001cfe0e;
                }
              }
              else {
                if (vctxt->idcNodes == (xmlSchemaPSVIIDCNodePtr *)0x0) {
                  ppxVar16 = (xmlSchemaPSVIIDCNodePtr *)(*xmlMalloc)(0xa0);
                  vctxt->idcNodes = ppxVar16;
                  if (ppxVar16 == (xmlSchemaPSVIIDCNodePtr *)0x0) {
                    pcVar22 = "allocating the IDC node table item list";
LAB_001cfdc4:
                    if (vctxt != (xmlSchemaValidCtxtPtr)0x0) {
                      vctxt->nberrors = vctxt->nberrors + 1;
                      vctxt->err = 0x71a;
                    }
                    __xmlSimpleError(0x11,2,(xmlNodePtr)0x0,(char *)0x0,pcVar22);
                    (*xmlFree)(local_80);
                    goto LAB_001cfdfa;
                  }
                  vctxt->sizeIdcNodes = 0x14;
                }
                else {
                  iVar7 = vctxt->sizeIdcNodes;
                  if (iVar7 <= vctxt->nbIdcNodes) {
                    vctxt->sizeIdcNodes = iVar7 * 2;
                    ppxVar16 = (xmlSchemaPSVIIDCNodePtr *)
                               (*xmlRealloc)(vctxt->idcNodes,(long)iVar7 << 4);
                    vctxt->idcNodes = ppxVar16;
                    if (ppxVar16 == (xmlSchemaPSVIIDCNodePtr *)0x0) {
                      pcVar22 = "re-allocating the IDC node table item list";
                      goto LAB_001cfdc4;
                    }
                  }
                }
                iVar7 = vctxt->nbIdcNodes;
                vctxt->nbIdcNodes = iVar7 + 1;
                vctxt->idcNodes[iVar7] = local_80;
                local_80->nodeQNameID = -1;
              }
              local_80->node = vctxt->node;
              local_80->nodeLine = vctxt->inode->nodeLine;
              local_80->keys = *pppxVar10;
              *pppxVar10 = (xmlSchemaPSVIIDCKeyPtr *)0x0;
              iVar7 = xmlSchemaItemListAdd(pxVar8,local_80);
              pxVar12 = local_80;
              if (iVar7 != -1) {
                if (local_58->type != XML_SCHEMA_TYPE_IDC_KEYREF) {
                  local_88 = (xmlChar *)0x0;
                  if (pxVar3->htab == (xmlHashTablePtr)0x0) {
                    pxVar17 = xmlHashCreate(4);
                    pxVar3->htab = pxVar17;
                  }
                  xmlSchemaFormatIDCKeySequence_1(vctxt,&local_88,local_80->keys,(int)local_70,1);
                  userdata = (undefined8 *)(*xmlMalloc)(0x10);
                  pxVar15 = local_88;
                  *(int *)(userdata + 1) = pxVar8->nbItems + -1;
                  puVar18 = (undefined8 *)xmlHashLookup(pxVar3->htab,local_88);
                  if (puVar18 == (undefined8 *)0x0) {
                    *userdata = 0;
                    xmlHashAddEntry(pxVar3->htab,pxVar15,userdata);
                  }
                  else {
                    *userdata = *puVar18;
                    *puVar18 = userdata;
                  }
                  if (pxVar15 != (xmlChar *)0x0) {
                    (*xmlFree)(pxVar15);
                    local_88 = (xmlChar *)0x0;
                  }
                }
                goto LAB_001cf4af;
              }
              if (local_58->type == XML_SCHEMA_TYPE_IDC_KEYREF) {
                (*xmlFree)(local_80->keys);
                (*xmlFree)(pxVar12);
              }
            }
LAB_001cfe0e:
            iVar7 = 1;
          }
LAB_001cf4df:
          pxVar25 = local_78;
          if (iVar7 != 0) {
            return -1;
          }
LAB_001cf83e:
          *in_R8 = *in_R8 + -1;
        }
        else {
          if (pxVar26->type != 2) goto LAB_001cf83e;
          if ((pxVar25->type == XML_SCHEMA_TYPE_COMPLEX) ||
             (pxVar23 = pxVar25, pxVar25->builtInType == 0x2d)) {
            if ((pxVar25->contentType | XML_SCHEMA_CONTENT_ELEMENTS) == XML_SCHEMA_CONTENT_BASIC) {
              pxVar23 = pxVar25->contentTypeDef;
              if (pxVar23 == (xmlSchemaTypePtr)0x0) {
                pcVar22 = 
                "field resolves to a CT with simple content but the CT is missing the ST definition"
                ;
                goto LAB_001cfe2b;
              }
            }
            else {
              pxVar23 = (xmlSchemaTypePtr)0x0;
            }
          }
          if (pxVar23 == (xmlSchemaTypePtr)0x0) {
            local_88 = (xmlChar *)0x0;
            pxVar4 = pxVar26->matcher->aidc->def;
            pxVar15 = pxVar26->sel->xpath;
            local_78 = pxVar25;
            pxVar11 = xmlSchemaGetComponentDesignation(&local_88,pxVar4);
            xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_IDC,(xmlNodePtr)0x0,
                                (xmlSchemaBasicItemPtr)pxVar4,
                                "The XPath \'%s\' of a field of %s does evaluate to a node of non-simple type"
                                ,pxVar15,pxVar11,(xmlChar *)0x0,(xmlChar *)0x0);
            if (local_88 != (xmlChar *)0x0) {
              (*xmlFree)(local_88);
              local_88 = (xmlChar *)0x0;
            }
            *in_R8 = *in_R8 + -1;
            pxVar25 = local_78;
          }
          else if ((local_68 == (xmlNodePtr)0x0) && (vctxt->inode->val == (xmlSchemaValPtr)0x0)) {
            xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_IDC,(xmlNodePtr)0x0,
                                (xmlSchemaBasicItemPtr)pxVar26->matcher->aidc->def,
                                "Warning: No precomputed value available, the value was either invalid or something strange happened"
                                ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
            pxVar26->nbHistory = pxVar26->nbHistory + -1;
            local_68 = (xmlNodePtr)0x0;
          }
          else {
            pxVar3 = pxVar26->matcher;
            lVar20 = (long)pxVar26->depth - (long)pxVar3->depth;
            local_70 = (ulong)pxVar26->sel->index;
            iVar7 = (int)lVar20;
            if (pxVar3->keySeqs == (xmlSchemaPSVIIDCKeyPtr **)0x0) {
              uVar6 = iVar7 * 2;
              if (iVar7 < 10) {
                uVar6 = 10;
              }
              pxVar3->sizeKeySeqs = uVar6;
              pppxVar10 = (xmlSchemaPSVIIDCKeyPtr **)(*xmlMalloc)((ulong)uVar6 << 3);
              pxVar3->keySeqs = pppxVar10;
              if (pppxVar10 != (xmlSchemaPSVIIDCKeyPtr **)0x0) {
                local_78 = pxVar25;
                memset(pppxVar10,0,(long)pxVar3->sizeKeySeqs << 3);
                goto LAB_001cf593;
              }
              pcVar22 = "allocating an array of key-sequences";
LAB_001cf769:
              __xmlSimpleError(0x11,2,(xmlNodePtr)0x0,(char *)0x0,pcVar22);
              iVar7 = 1;
            }
            else {
              iVar1 = pxVar3->sizeKeySeqs;
              lVar24 = (long)iVar1;
              local_78 = pxVar25;
              if (iVar7 < iVar1) {
LAB_001cf593:
                pxVar25 = local_78;
                pxVar12 = (xmlSchemaPSVIIDCNodePtr)pxVar3->keySeqs[lVar20];
                if (pxVar12 == (xmlSchemaPSVIIDCNodePtr)0x0) {
                  pxVar12 = (xmlSchemaPSVIIDCNodePtr)
                            (*xmlMalloc)((long)pxVar3->aidc->def->nbFields << 3);
                  pxVar25 = local_78;
                  if (pxVar12 == (xmlSchemaPSVIIDCNodePtr)0x0) {
                    pcVar22 = "allocating an IDC key-sequence";
                    goto LAB_001cf769;
                  }
                  local_80 = pxVar12;
                  memset(pxVar12,0,(long)pxVar3->aidc->def->nbFields << 3);
                  pxVar3->keySeqs[lVar20] = (xmlSchemaPSVIIDCKeyPtr *)local_80;
                  pxVar12 = local_80;
                }
                else if ((&pxVar12->node)[local_70] != (xmlNodePtr)0x0) {
                  local_88 = (xmlChar *)0x0;
                  pxVar4 = pxVar3->aidc->def;
                  pxVar15 = pxVar26->sel->xpath;
                  pxVar11 = xmlSchemaGetComponentDesignation(&local_88,pxVar4);
                  xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_IDC,
                                      (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)pxVar4,
                                      "The XPath \'%s\' of a field of %s evaluates to a node-set with more than one member"
                                      ,pxVar15,pxVar11,(xmlChar *)0x0,(xmlChar *)0x0);
                  if (local_88 != (xmlChar *)0x0) {
                    (*xmlFree)(local_88);
                    local_88 = (xmlChar *)0x0;
                  }
                  *in_R8 = *in_R8 + -1;
                  iVar7 = 4;
                  goto LAB_001cf830;
                }
                pxVar13 = local_68;
                if (local_68 == (xmlNodePtr)0x0) {
                  local_80 = pxVar12;
                  pxVar13 = (xmlNodePtr)(*xmlMalloc)(0x10);
                  if (pxVar13 == (xmlNodePtr)0x0) {
                    __xmlSimpleError(0x11,2,(xmlNodePtr)0x0,(char *)0x0,"allocating a IDC key");
                    (*xmlFree)(local_80);
                    pxVar3->keySeqs[lVar20] = (xmlSchemaPSVIIDCKeyPtr *)0x0;
                    iVar7 = 1;
                    local_68 = (xmlNodePtr)0x0;
                    goto LAB_001cf830;
                  }
                  pxVar13->_private = pxVar23;
                  pxVar5 = vctxt->inode;
                  *(xmlSchemaValPtr *)&pxVar13->type = pxVar5->val;
                  pxVar5->val = (xmlSchemaValPtr)0x0;
                  if (vctxt->idcKeys == (xmlSchemaPSVIIDCKeyPtr *)0x0) {
                    ppxVar14 = (xmlSchemaPSVIIDCKeyPtr *)(*xmlMalloc)(0x140);
                    vctxt->idcKeys = ppxVar14;
                    if (ppxVar14 == (xmlSchemaPSVIIDCKeyPtr *)0x0) {
                      pcVar22 = "allocating the IDC key storage list";
LAB_001cfd0c:
                      if (vctxt != (xmlSchemaValidCtxtPtr)0x0) {
                        vctxt->nberrors = vctxt->nberrors + 1;
                        vctxt->err = 0x71a;
                      }
                      __xmlSimpleError(0x11,2,(xmlNodePtr)0x0,(char *)0x0,pcVar22);
                      local_68 = pxVar13;
                      if (*(xmlSchemaValPtr *)&pxVar13->type != (xmlSchemaValPtr)0x0) {
                        xmlSchemaFreeValue(*(xmlSchemaValPtr *)&pxVar13->type);
                      }
                      (*xmlFree)(local_68);
                      iVar7 = 1;
                      goto LAB_001cf830;
                    }
                    vctxt->sizeIdcKeys = 0x28;
                  }
                  else {
                    iVar7 = vctxt->sizeIdcKeys;
                    if (iVar7 <= vctxt->nbIdcKeys) {
                      vctxt->sizeIdcKeys = iVar7 * 2;
                      ppxVar14 = (xmlSchemaPSVIIDCKeyPtr *)
                                 (*xmlRealloc)(vctxt->idcKeys,(long)iVar7 << 4);
                      vctxt->idcKeys = ppxVar14;
                      if (ppxVar14 == (xmlSchemaPSVIIDCKeyPtr *)0x0) {
                        pcVar22 = "re-allocating the IDC key storage list";
                        goto LAB_001cfd0c;
                      }
                    }
                  }
                  iVar7 = vctxt->nbIdcKeys;
                  vctxt->nbIdcKeys = iVar7 + 1;
                  vctxt->idcKeys[iVar7] = (xmlSchemaPSVIIDCKeyPtr)pxVar13;
                  pxVar12 = local_80;
                }
                (&pxVar12->node)[local_70] = pxVar13;
                iVar7 = 0;
                local_68 = pxVar13;
              }
              else {
                pxVar3->sizeKeySeqs = iVar1 * 2;
                pppxVar10 = (xmlSchemaPSVIIDCKeyPtr **)(*xmlRealloc)(pxVar3->keySeqs,lVar24 << 4);
                pxVar3->keySeqs = pppxVar10;
                if (pppxVar10 == (xmlSchemaPSVIIDCKeyPtr **)0x0) {
                  __xmlSimpleError(0x11,2,(xmlNodePtr)0x0,(char *)0x0,
                                   "reallocating an array of key-sequences");
                }
                else {
                  iVar7 = pxVar3->sizeKeySeqs;
                  if (iVar1 < iVar7) {
                    do {
                      pxVar3->keySeqs[lVar24] = (xmlSchemaPSVIIDCKeyPtr *)0x0;
                      lVar24 = lVar24 + 1;
                    } while (iVar7 != lVar24);
                  }
                }
                if (pppxVar10 != (xmlSchemaPSVIIDCKeyPtr **)0x0) goto LAB_001cf593;
                iVar7 = 1;
                pxVar25 = local_78;
              }
            }
LAB_001cf830:
            if (iVar7 == 0) goto LAB_001cf83e;
            if (iVar7 != 4) {
              return -1;
            }
          }
        }
LAB_001cf841:
        in_R8 = &pxVar26->nbHistory;
        if ((*in_R8 != 0) || (pxVar26->depth != depth)) goto LAB_001cf0f4;
        if (vctxt->xpathStates != pxVar26) {
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaXPathProcessHistory",
                     "The state object to be removed is not the first in the list",(xmlChar *)0x0,
                     (xmlChar *)in_R8);
        }
        pxVar27 = pxVar26->next;
        vctxt->xpathStates = pxVar27;
        pxVar26->next = vctxt->xpathStatePool;
        vctxt->xpathStatePool = pxVar26;
      }
      else {
LAB_001cf0f4:
        pxVar27 = pxVar26->next;
      }
      pxVar26 = pxVar27;
    } while (pxVar27 != (xmlSchemaIDCStateObjPtr)0x0);
  }
  return 0;
}

Assistant:

static int
xmlSchemaXPathProcessHistory(xmlSchemaValidCtxtPtr vctxt,
			     int depth)
{
    xmlSchemaIDCStateObjPtr sto, nextsto;
    int res, matchDepth;
    xmlSchemaPSVIIDCKeyPtr key = NULL;
    xmlSchemaTypePtr type = vctxt->inode->typeDef, simpleType = NULL;

    if (vctxt->xpathStates == NULL)
	return (0);
    sto = vctxt->xpathStates;

#ifdef DEBUG_IDC
    {
	xmlChar *str = NULL;
	xmlGenericError(xmlGenericErrorContext,
	    "IDC: BACK on %s, depth %d\n",
	    xmlSchemaFormatQName(&str, vctxt->inode->nsName,
		vctxt->inode->localName), vctxt->depth);
	FREE_AND_NULL(str)
    }
#endif
    /*
    * Evaluate the state objects.
    */
    while (sto != NULL) {
	res = xmlStreamPop((xmlStreamCtxtPtr) sto->xpathCtxt);
	if (res == -1) {
	    VERROR_INT("xmlSchemaXPathProcessHistory",
		"calling xmlStreamPop()");
	    return (-1);
	}
#ifdef DEBUG_IDC
	xmlGenericError(xmlGenericErrorContext, "IDC:   stream pop '%s'\n",
	    sto->sel->xpath);
#endif
	if (sto->nbHistory == 0)
	    goto deregister_check;

	matchDepth = sto->history[sto->nbHistory -1];

	/*
	* Only matches at the current depth are of interest.
	*/
	if (matchDepth != depth) {
	    sto = sto->next;
	    continue;
	}
	if (sto->type == XPATH_STATE_OBJ_TYPE_IDC_FIELD) {
	    /*
	    * NOTE: According to
	    *   http://www.w3.org/Bugs/Public/show_bug.cgi?id=2198
	    *   ... the simple-content of complex types is also allowed.
	    */

	    if (WXS_IS_COMPLEX(type)) {
		if (WXS_HAS_SIMPLE_CONTENT(type)) {
		    /*
		    * Sanity check for complex types with simple content.
		    */
		    simpleType = type->contentTypeDef;
		    if (simpleType == NULL) {
			VERROR_INT("xmlSchemaXPathProcessHistory",
			    "field resolves to a CT with simple content "
			    "but the CT is missing the ST definition");
			return (-1);
		    }
		} else
		    simpleType = NULL;
	    } else
		simpleType = type;
	    if (simpleType == NULL) {
		xmlChar *str = NULL;

		/*
		* Not qualified if the field resolves to a node of non
		* simple type.
		*/
		xmlSchemaCustomErr(ACTXT_CAST vctxt,
		    XML_SCHEMAV_CVC_IDC, NULL,
		    WXS_BASIC_CAST sto->matcher->aidc->def,
		    "The XPath '%s' of a field of %s does evaluate to a node of "
		    "non-simple type",
		    sto->sel->xpath,
		    xmlSchemaGetIDCDesignation(&str, sto->matcher->aidc->def));
		FREE_AND_NULL(str);
		sto->nbHistory--;
		goto deregister_check;
	    }

	    if ((key == NULL) && (vctxt->inode->val == NULL)) {
		/*
		* Failed to provide the normalized value; maybe
		* the value was invalid.
		*/
		VERROR(XML_SCHEMAV_CVC_IDC,
		    WXS_BASIC_CAST sto->matcher->aidc->def,
		    "Warning: No precomputed value available, the value "
		    "was either invalid or something strange happened");
		sto->nbHistory--;
		goto deregister_check;
	    } else {
		xmlSchemaIDCMatcherPtr matcher = sto->matcher;
		xmlSchemaPSVIIDCKeyPtr *keySeq;
		int pos, idx;

		/*
		* The key will be anchored on the matcher's list of
		* key-sequences. The position in this list is determined
		* by the target node's depth relative to the matcher's
		* depth of creation (i.e. the depth of the scope element).
		*
		* Element        Depth    Pos   List-entries
		* <scope>          0              NULL
		*   <bar>          1              NULL
		*     <target/>    2       2      target
		*   <bar>
                * </scope>
		*
		* The size of the list is only dependent on the depth of
		* the tree.
		* An entry will be NULLed in selector_leave, i.e. when
		* we hit the target's
		*/
		pos = sto->depth - matcher->depth;
		idx = sto->sel->index;

		/*
		* Create/grow the array of key-sequences.
		*/
		if (matcher->keySeqs == NULL) {
		    if (pos > 9)
			matcher->sizeKeySeqs = pos * 2;
		    else
			matcher->sizeKeySeqs = 10;
		    matcher->keySeqs = (xmlSchemaPSVIIDCKeyPtr **)
			xmlMalloc(matcher->sizeKeySeqs *
			sizeof(xmlSchemaPSVIIDCKeyPtr *));
		    if (matcher->keySeqs == NULL) {
			xmlSchemaVErrMemory(NULL,
			    "allocating an array of key-sequences",
			    NULL);
			return(-1);
		    }
		    memset(matcher->keySeqs, 0,
			matcher->sizeKeySeqs *
			sizeof(xmlSchemaPSVIIDCKeyPtr *));
		} else if (pos >= matcher->sizeKeySeqs) {
		    int i = matcher->sizeKeySeqs;

		    matcher->sizeKeySeqs *= 2;
		    matcher->keySeqs = (xmlSchemaPSVIIDCKeyPtr **)
			xmlRealloc(matcher->keySeqs,
			matcher->sizeKeySeqs *
			sizeof(xmlSchemaPSVIIDCKeyPtr *));
		    if (matcher->keySeqs == NULL) {
			xmlSchemaVErrMemory(NULL,
			    "reallocating an array of key-sequences",
			    NULL);
			return (-1);
		    }
		    /*
		    * The array needs to be NULLed.
		    * TODO: Use memset?
		    */
		    for (; i < matcher->sizeKeySeqs; i++)
			matcher->keySeqs[i] = NULL;
		}

		/*
		* Get/create the key-sequence.
		*/
		keySeq = matcher->keySeqs[pos];
		if (keySeq == NULL) {
		    goto create_sequence;
		} else if (keySeq[idx] != NULL) {
		    xmlChar *str = NULL;
		    /*
		    * cvc-identity-constraint:
		    * 3 For each node in the `target node set` all
		    * of the {fields}, with that node as the context
		    * node, evaluate to either an empty node-set or
		    * a node-set with exactly one member, which must
		    * have a simple type.
		    *
		    * The key was already set; report an error.
		    */
		    xmlSchemaCustomErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_IDC, NULL,
			WXS_BASIC_CAST matcher->aidc->def,
			"The XPath '%s' of a field of %s evaluates to a "
			"node-set with more than one member",
			sto->sel->xpath,
			xmlSchemaGetIDCDesignation(&str, matcher->aidc->def));
		    FREE_AND_NULL(str);
		    sto->nbHistory--;
		    goto deregister_check;
		} else
		    goto create_key;

create_sequence:
		/*
		* Create a key-sequence.
		*/
		keySeq = (xmlSchemaPSVIIDCKeyPtr *) xmlMalloc(
		    matcher->aidc->def->nbFields *
		    sizeof(xmlSchemaPSVIIDCKeyPtr));
		if (keySeq == NULL) {
		    xmlSchemaVErrMemory(NULL,
			"allocating an IDC key-sequence", NULL);
		    return(-1);
		}
		memset(keySeq, 0, matcher->aidc->def->nbFields *
		    sizeof(xmlSchemaPSVIIDCKeyPtr));
		matcher->keySeqs[pos] = keySeq;
create_key:
		/*
		* Create a key once per node only.
		*/
		if (key == NULL) {
		    key = (xmlSchemaPSVIIDCKeyPtr) xmlMalloc(
			sizeof(xmlSchemaPSVIIDCKey));
		    if (key == NULL) {
			xmlSchemaVErrMemory(NULL,
			    "allocating a IDC key", NULL);
			xmlFree(keySeq);
			matcher->keySeqs[pos] = NULL;
			return(-1);
		    }
		    /*
		    * Consume the compiled value.
		    */
		    key->type = simpleType;
		    key->val = vctxt->inode->val;
		    vctxt->inode->val = NULL;
		    /*
		    * Store the key in a global list.
		    */
		    if (xmlSchemaIDCStoreKey(vctxt, key) == -1) {
			xmlSchemaIDCFreeKey(key);
			return (-1);
		    }
		}
		keySeq[idx] = key;
	    }
	} else if (sto->type == XPATH_STATE_OBJ_TYPE_IDC_SELECTOR) {

	    xmlSchemaPSVIIDCKeyPtr **keySeq = NULL;
	    /* xmlSchemaPSVIIDCBindingPtr bind; */
	    xmlSchemaPSVIIDCNodePtr ntItem;
	    xmlSchemaIDCMatcherPtr matcher;
	    xmlSchemaIDCPtr idc;
	    xmlSchemaItemListPtr targets;
	    int pos, i, j, nbKeys;
	    /*
	    * Here we have the following scenario:
	    * An IDC 'selector' state object resolved to a target node,
	    * during the time this target node was in the
	    * ancestor-or-self axis, the 'field' state object(s) looked
	    * out for matching nodes to create a key-sequence for this
	    * target node. Now we are back to this target node and need
	    * to put the key-sequence, together with the target node
	    * itself, into the node-table of the corresponding IDC
	    * binding.
	    */
	    matcher = sto->matcher;
	    idc = matcher->aidc->def;
	    nbKeys = idc->nbFields;
	    pos = depth - matcher->depth;
	    /*
	    * Check if the matcher has any key-sequences at all, plus
	    * if it has a key-sequence for the current target node.
	    */
	    if ((matcher->keySeqs == NULL) ||
		(matcher->sizeKeySeqs <= pos)) {
		if (idc->type == XML_SCHEMA_TYPE_IDC_KEY)
		    goto selector_key_error;
		else
		    goto selector_leave;
	    }

	    keySeq = &(matcher->keySeqs[pos]);
	    if (*keySeq == NULL) {
		if (idc->type == XML_SCHEMA_TYPE_IDC_KEY)
		    goto selector_key_error;
		else
		    goto selector_leave;
	    }

	    for (i = 0; i < nbKeys; i++) {
		if ((*keySeq)[i] == NULL) {
		    /*
		    * Not qualified, if not all fields did resolve.
		    */
		    if (idc->type == XML_SCHEMA_TYPE_IDC_KEY) {
			/*
			* All fields of a "key" IDC must resolve.
			*/
			goto selector_key_error;
		    }
		    goto selector_leave;
		}
	    }
	    /*
	    * All fields did resolve.
	    */

	    /*
	    * 4.1 If the {identity-constraint category} is unique(/key),
	    * then no two members of the `qualified node set` have
	    * `key-sequences` whose members are pairwise equal, as
	    * defined by Equal in [XML Schemas: Datatypes].
	    *
	    * Get the IDC binding from the matcher and check for
	    * duplicate key-sequences.
	    */
#if 0
	    bind = xmlSchemaIDCAcquireBinding(vctxt, matcher);
#endif
	    targets = xmlSchemaIDCAcquireTargetList(vctxt, matcher);
	    if ((idc->type != XML_SCHEMA_TYPE_IDC_KEYREF) &&
		(targets->nbItems != 0)) {
		xmlSchemaPSVIIDCKeyPtr ckey, bkey, *bkeySeq;
		xmlIDCHashEntryPtr e;

		res = 0;

		if (!matcher->htab)
		    e = NULL;
		else {
		    xmlChar *value = NULL;
		    xmlSchemaHashKeySequence(vctxt, &value, *keySeq, nbKeys);
		    e = xmlHashLookup(matcher->htab, value);
		    FREE_AND_NULL(value);
		}

		/*
		* Compare the key-sequences, key by key.
		*/
		for (;e; e = e->next) {
		    bkeySeq =
			((xmlSchemaPSVIIDCNodePtr) targets->items[e->index])->keys;
		    for (j = 0; j < nbKeys; j++) {
			ckey = (*keySeq)[j];
			bkey = bkeySeq[j];
			res = xmlSchemaAreValuesEqual(ckey->val, bkey->val);
			if (res == -1) {
			    return (-1);
			} else if (res == 0) {
			    /*
			    * One of the keys differs, so the key-sequence
			    * won't be equal; get out.
			    */
			    break;
			}
		    }
		    if (res == 1) {
			/*
			* Duplicate key-sequence found.
			*/
			break;
		    }
		}
		if (e) {
		    xmlChar *str = NULL, *strB = NULL;
		    /*
		    * TODO: Try to report the key-sequence.
		    */
		    xmlSchemaCustomErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_IDC, NULL,
			WXS_BASIC_CAST idc,
			"Duplicate key-sequence %s in %s",
			xmlSchemaFormatIDCKeySequence(vctxt, &str,
			    (*keySeq), nbKeys),
			xmlSchemaGetIDCDesignation(&strB, idc));
		    FREE_AND_NULL(str);
		    FREE_AND_NULL(strB);
		    goto selector_leave;
		}
	    }
	    /*
	    * Add a node-table item to the IDC binding.
	    */
	    ntItem = (xmlSchemaPSVIIDCNodePtr) xmlMalloc(
		sizeof(xmlSchemaPSVIIDCNode));
	    if (ntItem == NULL) {
		xmlSchemaVErrMemory(NULL,
		    "allocating an IDC node-table item", NULL);
		xmlFree(*keySeq);
		*keySeq = NULL;
		return(-1);
	    }
	    memset(ntItem, 0, sizeof(xmlSchemaPSVIIDCNode));

	    /*
	    * Store the node-table item in a global list.
	    */
	    if (idc->type != XML_SCHEMA_TYPE_IDC_KEYREF) {
		if (xmlSchemaIDCStoreNodeTableItem(vctxt, ntItem) == -1) {
		    xmlFree(ntItem);
		    xmlFree(*keySeq);
		    *keySeq = NULL;
		    return (-1);
		}
		ntItem->nodeQNameID = -1;
	    } else {
		/*
		* Save a cached QName for this node on the IDC node, to be
		* able to report it, even if the node is not saved.
		*/
		ntItem->nodeQNameID = xmlSchemaVAddNodeQName(vctxt,
		    vctxt->inode->localName, vctxt->inode->nsName);
		if (ntItem->nodeQNameID == -1) {
		    xmlFree(ntItem);
		    xmlFree(*keySeq);
		    *keySeq = NULL;
		    return (-1);
		}
	    }
	    /*
	    * Init the node-table item: Save the node, position and
	    * consume the key-sequence.
	    */
	    ntItem->node = vctxt->node;
	    ntItem->nodeLine = vctxt->inode->nodeLine;
	    ntItem->keys = *keySeq;
	    *keySeq = NULL;
#if 0
	    if (xmlSchemaIDCAppendNodeTableItem(bind, ntItem) == -1)
#endif
	    if (xmlSchemaItemListAdd(targets, ntItem) == -1) {
		if (idc->type == XML_SCHEMA_TYPE_IDC_KEYREF) {
		    /*
		    * Free the item, since keyref items won't be
		    * put on a global list.
		    */
		    xmlFree(ntItem->keys);
		    xmlFree(ntItem);
		}
		return (-1);
	    }
	    if (idc->type != XML_SCHEMA_TYPE_IDC_KEYREF) {
		xmlChar *value = NULL;
		xmlIDCHashEntryPtr r, e;
		if (!matcher->htab)
		  matcher->htab = xmlHashCreate(4);
		xmlSchemaHashKeySequence(vctxt, &value, ntItem->keys, nbKeys);
		e = xmlMalloc(sizeof *e);
		e->index = targets->nbItems - 1;
		r = xmlHashLookup(matcher->htab, value);
		if (r) {
		    e->next = r->next;
		    r->next = e;
		} else {
		    e->next = NULL;
		    xmlHashAddEntry(matcher->htab, value, e);
		}
		FREE_AND_NULL(value);
	    }

	    goto selector_leave;
selector_key_error:
	    {
		xmlChar *str = NULL;
		/*
		* 4.2.1 (KEY) The `target node set` and the
		* `qualified node set` are equal, that is, every
		* member of the `target node set` is also a member
		* of the `qualified node set` and vice versa.
		*/
		xmlSchemaCustomErr(ACTXT_CAST vctxt,
		    XML_SCHEMAV_CVC_IDC, NULL,
		    WXS_BASIC_CAST idc,
		    "Not all fields of %s evaluate to a node",
		    xmlSchemaGetIDCDesignation(&str, idc), NULL);
		FREE_AND_NULL(str);
	    }
selector_leave:
	    /*
	    * Free the key-sequence if not added to the IDC table.
	    */
	    if ((keySeq != NULL) && (*keySeq != NULL)) {
		xmlFree(*keySeq);
		*keySeq = NULL;
	    }
	} /* if selector */

	sto->nbHistory--;

deregister_check:
	/*
	* Deregister state objects if they reach the depth of creation.
	*/
	if ((sto->nbHistory == 0) && (sto->depth == depth)) {
#ifdef DEBUG_IDC
	    xmlGenericError(xmlGenericErrorContext, "IDC:   STO pop '%s'\n",
		sto->sel->xpath);
#endif
	    if (vctxt->xpathStates != sto) {
		VERROR_INT("xmlSchemaXPathProcessHistory",
		    "The state object to be removed is not the first "
		    "in the list");
	    }
	    nextsto = sto->next;
	    /*
	    * Unlink from the list of active XPath state objects.
	    */
	    vctxt->xpathStates = sto->next;
	    sto->next = vctxt->xpathStatePool;
	    /*
	    * Link it to the pool of reusable state objects.
	    */
	    vctxt->xpathStatePool = sto;
	    sto = nextsto;
	} else
	    sto = sto->next;
    } /* while (sto != NULL) */
    return (0);
}